

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void duckdb::TemplatedFetchCommittedRange<float>
               (UpdateInfo *info,idx_t start,idx_t end,idx_t result_offset,Vector *result)

{
  uint uVar1;
  uint uVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = info->N;
  if ((ulong)uVar1 != 0) {
    uVar2 = info->max;
    pdVar3 = result->data;
    uVar4 = 0;
    do {
      uVar5 = (ulong)*(uint *)((long)&info[1].segment + uVar4 * 4);
      if (start <= uVar5) {
        if (end <= uVar5) {
          return;
        }
        *(undefined4 *)(pdVar3 + uVar5 * 4 + (result_offset - start) * 4) =
             *(undefined4 *)((long)&info[1].segment + uVar4 * 4 + (ulong)uVar2 * 4);
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return;
}

Assistant:

static void TemplatedFetchCommittedRange(UpdateInfo &info, idx_t start, idx_t end, idx_t result_offset,
                                         Vector &result) {
	auto result_data = FlatVector::GetData<T>(result);
	MergeUpdateInfoRange<T>(info, start, end, result_offset, result_data);
}